

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Image.c
# Opt level: O0

void Llb_ImgQuantifyReset(Vec_Ptr_t *vDdMans)

{
  int iVar1;
  DdManager *table;
  int local_1c;
  int i;
  DdManager *dd;
  Vec_Ptr_t *vDdMans_local;
  
  local_1c = 0;
  while( true ) {
    iVar1 = Vec_PtrSize(vDdMans);
    if (iVar1 <= local_1c) {
      return;
    }
    table = (DdManager *)Vec_PtrEntry(vDdMans,local_1c);
    if (table->bFunc2 == (DdNode *)0x0) break;
    Cudd_RecursiveDeref(table,table->bFunc);
    table->bFunc = table->bFunc2;
    table->bFunc2 = (DdNode *)0x0;
    local_1c = local_1c + 1;
  }
  __assert_fail("dd->bFunc2 != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb2Image.c"
                ,0x15a,"void Llb_ImgQuantifyReset(Vec_Ptr_t *)");
}

Assistant:

void Llb_ImgQuantifyReset( Vec_Ptr_t * vDdMans )
{
    DdManager * dd;
    int i;
    Vec_PtrForEachEntry( DdManager *, vDdMans, dd, i )
    {
        assert( dd->bFunc2 != NULL );
        Cudd_RecursiveDeref( dd, dd->bFunc );
        dd->bFunc = dd->bFunc2;
        dd->bFunc2 = NULL;
    }
}